

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyraytracer.cpp
# Opt level: O3

bool scene_intersect(Vec3f *orig,Vec3f *dir,vector<Sphere,_std::allocator<Sphere>_> *spheres,
                    Vec3f *hit,Vec3f *N,Material *material)

{
  pointer pSVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  vec<3UL,_float> *pvVar6;
  long lVar7;
  pointer pSVar8;
  float fVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float dist_i;
  Sphere sphere;
  vec<3UL,_float> local_a8;
  float local_98;
  float local_94;
  Vec3f *local_90;
  Vec3f *local_88;
  Material *local_80;
  Sphere local_78;
  vec<3UL,_float> local_40;
  
  pSVar8 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_98 = 3.4028235e+38;
  local_90 = N;
  local_88 = hit;
  local_80 = material;
  if (pSVar8 != pSVar1) {
    local_98 = 3.4028235e+38;
    do {
      local_78.material.specular_exponent = (pSVar8->material).specular_exponent;
      local_78.center.x = (pSVar8->center).x;
      local_78.center.y = (pSVar8->center).y;
      local_78._8_8_ = *(undefined8 *)&(pSVar8->center).z;
      local_78.material.refractive_index = (pSVar8->material).refractive_index;
      local_78.material.albedo.x = (pSVar8->material).albedo.x;
      local_78.material.albedo.y = (pSVar8->material).albedo.y;
      local_78.material.albedo.z = (pSVar8->material).albedo.z;
      local_78.material._16_8_ = *(undefined8 *)&(pSVar8->material).albedo.w;
      local_78.material.diffuse_color.y = (pSVar8->material).diffuse_color.y;
      local_78.material.diffuse_color.z = (pSVar8->material).diffuse_color.z;
      bVar4 = Sphere::ray_intersect(&local_78,orig,dir,&local_94);
      if ((bVar4) && (local_94 < local_98)) {
        fVar9 = orig->z;
        local_a8.x = 0.0;
        local_a8.y = 0.0;
        local_a8.z = 0.0;
        lVar5 = -1;
        do {
          lVar7 = (ulong)(lVar5 != 0) * 4 + 4;
          if (lVar5 == 1) {
            lVar7 = 0;
          }
          *(float *)((long)&local_a8.x + lVar7) = *(float *)((long)&dir->x + lVar7) * local_94;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 2);
        local_98 = local_94;
        local_40.x = local_a8.x;
        local_40.y = local_a8.y;
        local_40.z = local_a8.z;
        local_a8.x = orig->x;
        local_a8.y = orig->y;
        local_a8.z = fVar9;
        lVar5 = -1;
        do {
          lVar7 = 0;
          if (lVar5 != 1) {
            lVar7 = (ulong)(lVar5 != 0) * 4 + 4;
          }
          *(float *)((long)&local_a8.x + lVar7) =
               *(float *)((long)&local_a8.x + lVar7) + *(float *)((long)&local_40.x + lVar7);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 2);
        local_88->x = local_a8.x;
        local_88->y = local_a8.y;
        local_88->z = local_a8.z;
        lVar5 = -1;
        do {
          lVar7 = 0;
          if (lVar5 != 1) {
            lVar7 = (ulong)(lVar5 != 0) * 4 + 4;
          }
          *(float *)((long)&local_a8.x + lVar7) =
               *(float *)((long)&local_a8.x + lVar7) - *(float *)((long)&local_78.center.x + lVar7);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 2);
        pvVar6 = vec<3UL,_float>::normalize(&local_a8,1.0);
        fVar9 = pvVar6->y;
        local_90->x = pvVar6->x;
        local_90->y = fVar9;
        local_90->z = pvVar6->z;
        local_80->specular_exponent = local_78.material.specular_exponent;
        *(undefined8 *)&(local_80->albedo).w = local_78.material._16_8_;
        (local_80->diffuse_color).y = local_78.material.diffuse_color.y;
        (local_80->diffuse_color).z = local_78.material.diffuse_color.z;
        local_80->refractive_index = local_78.material.refractive_index;
        (local_80->albedo).x = local_78.material.albedo.x;
        (local_80->albedo).y = local_78.material.albedo.y;
        (local_80->albedo).z = local_78.material.albedo.z;
      }
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != pSVar1);
  }
  fVar9 = dir->y;
  if (ABS(fVar9) < 0.001 || ABS(fVar9) == 0.001) {
    fVar12 = 3.4028235e+38;
  }
  else {
    fVar9 = -(orig->y + 4.0) / fVar9;
    fVar12 = orig->z;
    local_78.center.x = 0.0;
    local_78.center.y = 0.0;
    local_78.center.z = 0.0;
    lVar5 = -1;
    do {
      lVar7 = (ulong)(lVar5 != 0) * 4 + 4;
      if (lVar5 == 1) {
        lVar7 = 0;
      }
      *(float *)((long)&local_78.center.x + lVar7) = *(float *)((long)&dir->x + lVar7) * fVar9;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
    local_a8.x = local_78.center.x;
    local_a8.y = local_78.center.y;
    local_a8.z = local_78.center.z;
    local_78.center.x = orig->x;
    local_78.center.y = orig->y;
    local_78.center.z = fVar12;
    lVar5 = -1;
    do {
      lVar7 = (ulong)(lVar5 != 0) * 4 + 4;
      if (lVar5 == 1) {
        lVar7 = 0;
      }
      *(float *)((long)&local_78.center.x + lVar7) =
           *(float *)((long)&local_78.center.x + lVar7) + *(float *)((long)&local_a8.x + lVar7);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
    fVar12 = 3.4028235e+38;
    if ((((0.0 < fVar9) && (ABS(local_78.center.x) < 10.0)) && (local_78.center.z < -10.0)) &&
       ((-30.0 < local_78.center.z && (fVar9 < local_98)))) {
      local_88->x = local_78.center.x;
      local_88->y = local_78.center.y;
      local_88->z = local_78.center.z;
      local_90->x = 0.0;
      local_90->y = 1.0;
      local_90->z = 0.0;
      uVar2 = (uint)(((int)(local_88->z * 0.5) + (int)(local_88->x * 0.5 + 1000.0) & 1U) == 0);
      uVar10 = CONCAT44((int)(uVar2 << 0x1f) >> 0x1f,(int)(uVar2 << 0x1f) >> 0x1f);
      uVar3 = (ulong)DAT_00104040;
      uVar11 = (ulong)DAT_00104050;
      (local_80->diffuse_color).x = 0.3;
      uVar11 = uVar10 & uVar11 | ~uVar10 & uVar3;
      (local_80->diffuse_color).y = (float)(int)uVar11;
      (local_80->diffuse_color).z = (float)(int)(uVar11 >> 0x20);
      fVar12 = fVar9;
    }
  }
  if (local_98 <= fVar12) {
    fVar12 = local_98;
  }
  return fVar12 < 1000.0;
}

Assistant:

bool scene_intersect(Vec3f const& orig, Vec3f const& dir,
                     std::vector<Sphere> const& spheres, Vec3f& hit, Vec3f& N,
                     Material& material)
{
  auto spheres_dist = std::numeric_limits<float>::max();
  for (auto sphere : spheres)
  {
    float dist_i;
    if (sphere.ray_intersect(orig, dir, dist_i) && dist_i < spheres_dist)
    {
      spheres_dist = dist_i;
      hit          = orig + dir * dist_i;
      N            = (hit - sphere.center).normalize();
      material     = sphere.material;
    }
  }

  float checkerboard_dist = std::numeric_limits<float>::max();
  if (fabs(dir.y) > 1e-3f)
  {
    float d  = -(orig.y + 4) / dir.y;  // Checkerboard plane is y = -4
    Vec3f pt = orig + dir * d;
    if (d > 0 && fabs(pt.x) < 10 && pt.z < -10 && pt.z > -30 &&
        d < spheres_dist)
    {
      checkerboard_dist = d;
      hit               = pt;
      N                 = Vec3f(0, 1, 0);
      material.diffuse_color =
          (int(.5f * hit.x + 1000) + int(.5f * hit.z)) & 1  // NOLINT
              ? Vec3f(.3f, .3f, .3f)
              : Vec3f(.3f, .2f, .1f);
    }
  }
  return std::min(spheres_dist, checkerboard_dist) < 1000;
}